

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

bool operator==(Matrix *lhs,Matrix *rhs)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Fraction *pFVar4;
  Fraction *pFVar5;
  int j;
  int i;
  
  if ((lhs->n_ == rhs->n_) && (lhs->m_ == rhs->m_)) {
    bVar1 = lhs->n_ < 1;
    if (0 < lhs->n_) {
      i = 0;
      do {
        bVar2 = 0 < lhs->m_;
        if (0 < lhs->m_) {
          pFVar4 = Matrix::At(lhs,i,0);
          pFVar5 = Matrix::At(rhs,i,0);
          bVar3 = operator!=(pFVar4,pFVar5);
          if (!bVar3) {
            j = 1;
            do {
              bVar2 = j < lhs->m_;
              if (lhs->m_ <= j) goto LAB_0010a854;
              pFVar4 = Matrix::At(lhs,i,j);
              pFVar5 = Matrix::At(rhs,i,j);
              bVar3 = operator!=(pFVar4,pFVar5);
              j = j + 1;
            } while (!bVar3);
          }
          if (bVar2) {
            return bVar1;
          }
        }
LAB_0010a854:
        i = i + 1;
        bVar1 = lhs->n_ <= i;
      } while (i < lhs->n_);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

int Matrix::GetNumRows() const {
  return n_;
}